

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTrace.cpp
# Opt level: O1

char * __thiscall llbuild::core::BuildEngineTrace::getTaskName(BuildEngineTrace *this,Task *task)

{
  FILE *__stream;
  ulong uVar1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  pair<std::__detail::_Node_iterator<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  pVar6;
  char name [64];
  Task *local_60;
  char local_58 [64];
  
  __stream = (FILE *)this->outputPtr;
  uVar1 = (this->taskNames)._M_h._M_bucket_count;
  uVar3 = (ulong)task % uVar1;
  p_Var4 = (this->taskNames)._M_h._M_buckets[uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4, p_Var4->_M_nxt[1]._M_nxt != (_Hash_node_base *)task)
     ) {
    while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var5 = p_Var4, p_Var2[1]._M_nxt == (_Hash_node_base *)task)) goto LAB_00167009;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_00167009:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var5->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    this->numNamedTasks = this->numNamedTasks + 1;
    local_60 = task;
    snprintf(local_58,0x40,"T%d");
    pVar6 = std::
            _Hashtable<llbuild::core::Task_const*,std::pair<llbuild::core::Task_const*const,std::__cxx11::string>,std::allocator<std::pair<llbuild::core::Task_const*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<llbuild::core::Task_const*>,std::hash<llbuild::core::Task_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<llbuild::core::Task_const*&,char(&)[64]>
                      ((_Hashtable<llbuild::core::Task_const*,std::pair<llbuild::core::Task_const*const,std::__cxx11::string>,std::allocator<std::pair<llbuild::core::Task_const*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<llbuild::core::Task_const*>,std::hash<llbuild::core::Task_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->taskNames,&local_60,local_58);
    fprintf(__stream,"{ \"new-task\", \"%s\" },\n",local_58);
    p_Var2 = *(_Hash_node_base **)
              ((long)pVar6.first.
                     super__Node_iterator_base<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                     ._M_cur.
                     super__Node_iterator_base<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              + 0x10);
  }
  else {
    p_Var2 = p_Var2[2]._M_nxt;
  }
  return (char *)p_Var2;
}

Assistant:

const char* BuildEngineTrace::getTaskName(const Task* task) {
  FILE *fp = static_cast<FILE*>(outputPtr);

  // See if we have already assigned a name.
  auto it = taskNames.find(task);
  if (it != taskNames.end())
    return it->second.c_str();

  // Otherwise, create a name.
  char name[64];
  snprintf(name, sizeof(name), "T%d", ++numNamedTasks);
  auto result = taskNames.emplace(task, name);

  // Report the newly seen rule.
  fprintf(fp, "{ \"new-task\", \"%s\" },\n", name);

  return result.first->second.c_str();
}